

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

bool __thiscall Potassco::AspifTextInput::parseStatements(AspifTextInput *this)

{
  char c;
  bool bVar1;
  Data data;
  
  ProgramReader::require
            (&this->super_ProgramReader,this->out_ != (AbstractProgram *)0x0,"output not set");
  Data::Data(&data);
  this->data_ = &data;
  do {
    c = ProgramReader::peek(&this->super_ProgramReader,true);
    if (c == '#') {
      bVar1 = matchDirective(this);
      if (!bVar1) goto LAB_0010958c;
    }
    else if (c == '%') {
      ProgramReader::skipLine(&this->super_ProgramReader);
    }
    else if (c == '.') {
      match(this,".",true);
    }
    else {
      if (c == '\0') {
LAB_0010958c:
        Data::~Data(&data);
        return true;
      }
      matchRule(this,c);
    }
    Data::clear(&data);
  } while( true );
}

Assistant:

bool AspifTextInput::parseStatements() {
	require(out_ != 0, "output not set");
	Data data;
	data_ = &data;
	for (char c; (c = peek(true)) != 0; data.clear()) {
		if      (c == '.') { match("."); }
		else if (c == '#') { if (!matchDirective()) break; }
		else if (c == '%') { skipLine(); }
		else               { matchRule(c); }
	}
	return true;
}